

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal.cpp
# Opt level: O3

uint32_t __thiscall
asmjit::RALocalAllocator::decideOnReassignment
          (RALocalAllocator *this,uint32_t group,uint32_t workId,uint32_t physId,
          uint32_t allocableRegs)

{
  uint32_t **ppuVar1;
  uint32_t **ppuVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  WorkToPhysMap *pWVar7;
  PhysToWorkMap *pPVar8;
  PhysToWorkMap *pPVar9;
  uint32_t *puVar10;
  uint32_t *puVar11;
  Error EVar12;
  uint uVar13;
  uint32_t uVar14;
  ulong uVar15;
  uint32_t *puVar16;
  BaseNode *pBVar17;
  Operand_ *pOVar18;
  ulong uVar19;
  void *pvVar20;
  RABlock *block;
  BaseRAPass *unaff_RBX;
  long lVar21;
  uint uVar22;
  ulong unaff_RBP;
  undefined4 in_register_00000034;
  BaseNode *pBVar23;
  InstNode *node;
  BaseCompiler *pBVar24;
  RALocalAllocator *this_00;
  undefined4 in_register_00000084;
  uint *puVar25;
  ulong uVar26;
  uint uVar27;
  ulong unaff_R12;
  uint uVar28;
  ulong unaff_R13;
  uint uVar29;
  ulong unaff_R14;
  uint uVar30;
  ulong unaff_R15;
  InstNode *pIVar31;
  bool bVar32;
  uint32_t uStack_f0;
  uint32_t uStack_ec;
  uint32_t uStack_e8;
  uint32_t uStack_e4;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  long lStack_c8;
  ulong uStack_c0;
  ulong uStack_b8;
  RALocalAllocator *pRStack_b0;
  InstNode *pIStack_a8;
  code *pcStack_a0;
  RALocalAllocator *pRStack_90;
  InstNode *pIStack_88;
  void *pvStack_80;
  BaseNode *pBStack_78;
  BaseRAPass *pBStack_70;
  ulong uStack_68;
  ulong uStack_60;
  ulong uStack_58;
  ulong uStack_50;
  ulong uStack_48;
  
  puVar25 = (uint *)CONCAT44(in_register_00000084,allocableRegs);
  pBVar23 = (BaseNode *)CONCAT44(in_register_00000034,group);
  if (allocableRegs == 0) {
    decideOnReassignment();
  }
  else if (workId < (this->_pass->_workRegs).super_ZoneVectorBase._size) {
    bVar3 = *(byte *)(*(long *)((long)(this->_pass->_workRegs).super_ZoneVectorBase._data +
                               (ulong)workId * 8) + 0x3a);
    uVar14 = (uint32_t)bVar3;
    if ((1 << (bVar3 & 0x1f) & allocableRegs) == 0) {
      uVar14 = 0xff;
    }
    if (bVar3 == 0xff) {
      uVar14 = 0xff;
    }
    return uVar14;
  }
  decideOnReassignment();
  if (physId == 0) {
LAB_0011c9d4:
    uStack_48 = 0x11c9d9;
    decideOnSpillFor();
  }
  else {
    uVar13 = 0;
    if (physId != 0) {
      for (; (physId >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
      }
    }
    uVar15 = (ulong)uVar13;
    uVar22 = 1 << ((byte)uVar13 & 0x1f);
    unaff_RBP = (ulong)uVar22;
    uVar19 = (ulong)pBVar23 & 0xffffffff;
    puVar16 = (this->_curAssignment)._physToWorkIds[uVar19];
    uVar28 = puVar16[uVar15];
    uVar26 = (ulong)uVar28;
    if (uVar22 == physId) {
LAB_0011c9bd:
      *puVar25 = uVar28;
      return uVar13;
    }
    unaff_RBX = this->_pass;
    uVar4 = (unaff_RBX->_workRegs).super_ZoneVectorBase._size;
    if (uVar28 < uVar4) {
      if ((uint)pBVar23 < 4) {
        pBVar23 = (BaseNode *)(unaff_RBX->_workRegs).super_ZoneVectorBase._data;
        uVar29 = (uint)(*(float *)((long)&(pBVar23->field_0)._links[uVar26][1]._passData + 4) *
                       1048576.0);
        uVar5 = (((this->_curAssignment)._physToWorkMap)->dirty)._masks[uVar19];
        this = (RALocalAllocator *)(ulong)uVar5;
        uVar28 = uVar29 + 0x40000;
        if ((uVar5 & uVar22) == 0) {
          uVar28 = uVar29;
        }
        unaff_RBX = (BaseRAPass *)(ulong)uVar28;
        uVar22 = physId ^ 1 << (uVar13 & 0x1f);
        do {
          uVar13 = 0;
          if (uVar22 != 0) {
            for (; (uVar22 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
            }
          }
          uVar28 = puVar16[uVar13];
          unaff_R14 = (ulong)uVar28;
          if (uVar4 <= uVar28) {
            uStack_48 = 0x11c9d4;
            decideOnSpillFor();
            goto LAB_0011c9d4;
          }
          uVar29 = 1 << ((byte)uVar13 & 0x1f);
          unaff_RBP = (ulong)uVar29;
          uVar30 = uVar22 ^ 1 << (uVar13 & 0x1f);
          unaff_R15 = (ulong)uVar30;
          uVar27 = (uint)(*(float *)((long)&(pBVar23->field_0)._links[unaff_R14][1]._passData + 4) *
                         1048576.0);
          unaff_R12 = (ulong)uVar27;
          uVar28 = uVar27 + 0x40000;
          if ((uVar5 >> (uVar13 & 0x1f) & 1) == 0) {
            uVar28 = uVar27;
          }
          unaff_R13 = (ulong)uVar28;
          bVar32 = uVar28 < (uint)unaff_RBX;
          if (bVar32) {
            unaff_RBX = (BaseRAPass *)(ulong)uVar28;
            uVar26 = unaff_R14;
          }
          uVar28 = (uint)uVar26;
          if (bVar32) {
            uVar15 = (ulong)uVar13;
          }
          uVar13 = (uint)uVar15;
          bVar32 = uVar29 != uVar22;
          uVar22 = uVar30;
        } while (bVar32);
        goto LAB_0011c9bd;
      }
      goto LAB_0011c9de;
    }
  }
  uStack_48 = 0x11c9de;
  decideOnSpillFor();
LAB_0011c9de:
  uStack_48 = 0x11c9e3;
  decideOnSpillFor();
  pvVar20 = pBVar23->_passData;
  node = (InstNode *)(ulong)*(uint *)((long)pvVar20 + 0xc);
  if (node != (InstNode *)0x0) {
    pRStack_90 = (RALocalAllocator *)&this->_curAssignment;
    lVar21 = (long)pvVar20 + 0x4c;
    pIVar31 = (InstNode *)0x0;
    this_00 = this;
    pIStack_88 = node;
    pvStack_80 = pvVar20;
    pBStack_78 = pBVar23;
    pBStack_70 = unaff_RBX;
    uStack_68 = unaff_R12;
    uStack_60 = unaff_R13;
    uStack_58 = unaff_R14;
    uStack_50 = unaff_R15;
    uStack_48 = unaff_RBP;
    do {
      if ((InstNode *)(ulong)*(uint *)((long)pvVar20 + 0xc) <= pIVar31) {
        pcStack_a0 = (code *)0x11cb0a;
        spillAfterAllocation();
LAB_0011cb0a:
        pcStack_a0 = (code *)0x11cb0f;
        spillAfterAllocation();
LAB_0011cb0f:
        pcStack_a0 = (code *)0x11cb14;
        spillAfterAllocation();
LAB_0011cb14:
        pcStack_a0 = (code *)0x11cb19;
        spillAfterAllocation();
LAB_0011cb19:
        pcStack_a0 = allocBranch;
        spillAfterAllocation();
        (this_00->_cc->super_BaseBuilder)._cursor = (node->super_BaseNode).field_0.field_0._prev;
        lStack_c8 = lVar21;
        uStack_c0 = unaff_R12;
        uStack_b8 = unaff_R13;
        pRStack_b0 = this;
        pIStack_a8 = pIVar31;
        pcStack_a0 = (code *)unaff_RBP;
        if ((block->_entryPhysToWorkMap != (PhysToWorkMap *)0x0) &&
           (EVar12 = switchToAssignment(this_00,block->_entryPhysToWorkMap,
                                        block->_entryWorkToPhysMap,block->_liveBits,
                                        SUB41((block->_flags & 8) >> 3,0),true), EVar12 != 0)) {
          return EVar12;
        }
        EVar12 = allocInst(this_00,node);
        if (EVar12 != 0) {
          return EVar12;
        }
        uVar13 = block->_sharedAssignmentId;
        if ((ulong)uVar13 == 0xffffffff) {
          puVar16 = &block->_entryScratchGpRegs;
LAB_0011cbbf:
          EVar12 = spillScratchGpRegsBeforeEntry(this_00,*puVar16);
          if (EVar12 != 0) {
            return EVar12;
          }
          if (block->_entryPhysToWorkMap == (PhysToWorkMap *)0x0) {
            EVar12 = BaseRAPass::setBlockEntryAssignment
                               (this_00->_pass,block,this_00->_block,&this_00->_curAssignment);
            if (EVar12 != 0) {
              return EVar12;
            }
          }
          else {
            pBVar23 = (this_00->_pass->_extraBlock->field_0).field_0._prev;
            pBVar17 = BaseBuilder::setCursor(&this_00->_cc->super_BaseBuilder,pBVar23);
            pWVar7 = (this_00->_curAssignment)._workToPhysMap;
            memcpy((this_00->_tmpAssignment)._physToWorkMap,(this_00->_curAssignment)._physToWorkMap
                   ,(ulong)(this_00->_tmpAssignment)._layout.physTotal * 4 + 0x20);
            memcpy((this_00->_tmpAssignment)._workToPhysMap,pWVar7,
                   (ulong)(this_00->_tmpAssignment)._layout.workCount);
            EVar12 = switchToAssignment(this_00,block->_entryPhysToWorkMap,
                                        block->_entryWorkToPhysMap,block->_liveBits,
                                        SUB41((block->_flags & 8) >> 3,0),false);
            if (EVar12 != 0) {
              return EVar12;
            }
            pBVar24 = this_00->_cc;
            if ((pBVar24->super_BaseBuilder)._cursor != pBVar23) {
              uVar13 = (node->super_BaseNode).field_1._any._reserved0 - 1;
              if ((node->super_BaseNode).field_1._any._reserved1 <= uVar13) goto LAB_0011cd6a;
              if ((node->_opArray[uVar13]._signature & 7) != 4) goto LAB_0011cd6f;
              (*(pBVar24->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[4])(&uStack_f0);
              pOVar18 = node->_opArray + uVar13;
              uStack_e0._0_4_ = pOVar18->_signature;
              uStack_e0._4_4_ = pOVar18->_baseId;
              uStack_d8 = *(undefined8 *)node->_opArray[uVar13]._data;
              pOVar18->_signature = uStack_f0;
              node->_opArray[uVar13]._baseId = uStack_ec;
              node->_opArray[uVar13]._data[0] = uStack_e8;
              node->_opArray[uVar13]._data[1] = uStack_e4;
              puVar16 = &(node->_baseInst)._options;
              *(byte *)puVar16 = (byte)*puVar16 & 0xef;
              uVar14 = (*(this_00->_pass->super_FuncPass).super_Pass._vptr_Pass[0xd])();
              if (uVar14 != 0) {
                return uVar14;
              }
              pBVar24 = this_00->_cc;
              (pBVar24->super_BaseBuilder)._cursor = pBVar23;
              (*(pBVar24->super_BaseBuilder).super_BaseEmitter._vptr_BaseEmitter[6])
                        (pBVar24,&uStack_f0);
              pBVar24 = this_00->_cc;
            }
            (pBVar24->super_BaseBuilder)._cursor = pBVar17;
            pWVar7 = (this_00->_curAssignment)._workToPhysMap;
            pPVar8 = (this_00->_curAssignment)._physToWorkMap;
            pPVar9 = (this_00->_tmpAssignment)._physToWorkMap;
            (this_00->_curAssignment)._workToPhysMap = (this_00->_tmpAssignment)._workToPhysMap;
            (this_00->_curAssignment)._physToWorkMap = pPVar9;
            (this_00->_tmpAssignment)._workToPhysMap = pWVar7;
            (this_00->_tmpAssignment)._physToWorkMap = pPVar8;
            lVar21 = 0;
            do {
              ppuVar1 = (this_00->_curAssignment)._physToWorkIds + lVar21;
              puVar16 = *ppuVar1;
              puVar10 = ppuVar1[1];
              ppuVar2 = (this_00->_tmpAssignment)._physToWorkIds + lVar21;
              puVar11 = ppuVar2[1];
              ppuVar1 = (this_00->_curAssignment)._physToWorkIds + lVar21;
              *ppuVar1 = *ppuVar2;
              ppuVar1[1] = puVar11;
              ppuVar1 = (this_00->_tmpAssignment)._physToWorkIds + lVar21;
              *ppuVar1 = puVar16;
              ppuVar1[1] = puVar10;
              lVar21 = lVar21 + 2;
            } while (lVar21 != 4);
          }
          uVar14 = 0;
        }
        else {
          if (uVar13 < (block->_ra->_sharedAssignments).super_ZoneVectorBase._size) {
            puVar16 = (uint32_t *)
                      ((ulong)uVar13 * 0x28 +
                      (long)(block->_ra->_sharedAssignments).super_ZoneVectorBase._data);
            goto LAB_0011cbbf;
          }
          allocBranch();
LAB_0011cd6a:
          allocBranch();
LAB_0011cd6f:
          uVar14 = 3;
        }
        return uVar14;
      }
      if ((*(byte *)(lVar21 + 2) & 2) != 0) {
        uVar13 = *(uint *)(lVar21 + -4);
        unaff_R12 = (ulong)uVar13;
        if ((this->_pass->_workRegs).super_ZoneVectorBase._size <= uVar13) goto LAB_0011cb0a;
        lVar6 = *(long *)((long)(this->_pass->_workRegs).super_ZoneVectorBase._data + unaff_R12 * 8)
        ;
        if (*(char *)(lVar6 + 0x3a) != -1) goto LAB_0011cae4;
        if ((this->_curAssignment)._layout.workCount <= uVar13) goto LAB_0011cb0f;
        bVar3 = (this->_curAssignment)._workToPhysMap[unaff_R12].physIds[0];
        unaff_RBP = (ulong)bVar3;
        if (bVar3 == 0xff) goto LAB_0011cae4;
        uVar28 = *(uint *)(lVar6 + 0x20);
        unaff_R13 = (ulong)uVar28;
        (this->_cc->super_BaseBuilder)._cursor = pBStack_78;
        if (0x1f < bVar3) goto LAB_0011cb14;
        uVar28 = uVar28 >> 8 & 0xf;
        unaff_R13 = (ulong)uVar28;
        if (uVar28 < 4) {
          if (((((this->_curAssignment)._physToWorkMap)->dirty)._masks[unaff_R13] >> (bVar3 & 0x1f)
              & 1) != 0) {
            pcStack_a0 = (code *)0x11cac4;
            EVar12 = onSaveReg(this,uVar28,uVar13,(uint)bVar3);
            if (EVar12 != 0) {
              return EVar12;
            }
          }
          pcStack_a0 = (code *)0x11cada;
          this_00 = pRStack_90;
          RAAssignment::unassign((RAAssignment *)pRStack_90,uVar28,uVar13,(uint)bVar3);
          pvVar20 = pvStack_80;
          node = pIStack_88;
          goto LAB_0011cae4;
        }
        goto LAB_0011cb19;
      }
LAB_0011cae4:
      pIVar31 = (InstNode *)((long)&(pIVar31->super_BaseNode).field_0 + 1);
      lVar21 = lVar21 + 0x18;
    } while (node != pIVar31);
  }
  return 0;
}

Assistant:

uint32_t RALocalAllocator::decideOnReassignment(uint32_t group, uint32_t workId, uint32_t physId, uint32_t allocableRegs) const noexcept {
  ASMJIT_ASSERT(allocableRegs != 0);
  DebugUtils::unused(group, physId);

  RAWorkReg* workReg = workRegById(workId);

  // Prefer allocating back to HomeId, if possible.
  if (workReg->hasHomeRegId()) {
    if (Support::bitTest(allocableRegs, workReg->homeRegId()))
      return workReg->homeRegId();
  }

  // TODO: [Register Allocator] This could be improved.

  // Decided to SPILL.
  return RAAssignment::kPhysNone;
}